

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_generator.cc
# Opt level: O3

int re2::CountArgs(string *s)

{
  char *pcVar1;
  int iVar2;
  
  pcVar1 = strstr((char *)s,"%s");
  iVar2 = 0;
  for (; pcVar1 != (char *)0x0; pcVar1 = strstr(pcVar1 + 2,"%s")) {
    iVar2 = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

static int CountArgs(const string& s) {
  const char *p = s.c_str();
  int n = 0;
  while ((p = strstr(p, "%s")) != NULL) {
    p += 2;
    n++;
  }
  return n;
}